

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O2

void __thiscall IDisk::SetWrite(IDisk *this,int side,uint track)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  MFMTrack *pMVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint i;
  MFMTrack *pMVar7;
  ulong uVar8;
  uchar *__s;
  uint uVar9;
  Side *pSVar10;
  long lVar11;
  ulong uVar12;
  
  uVar9 = this->side_[side].nb_tracks;
  if (uVar9 <= track) {
    pSVar10 = this->side_ + side;
    pMVar3 = pSVar10->tracks;
    pMVar7 = (MFMTrack *)operator_new__((ulong)(track + 1) << 5);
    pSVar10->tracks = pMVar7;
    uVar12 = (ulong)track;
    lVar11 = 0;
    memset(pMVar7,0,uVar12 * 0x20 + 1);
    for (uVar8 = 0; uVar8 < uVar9; uVar8 = uVar8 + 1) {
      pMVar7 = pSVar10->tracks;
      puVar1 = (undefined8 *)((long)&pMVar3->revolution + lVar11);
      uVar4 = *puVar1;
      uVar5 = puVar1[1];
      puVar1 = (undefined8 *)((long)&pMVar3->bitfield + lVar11);
      uVar6 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pMVar7->bitfield + lVar11);
      *puVar2 = *puVar1;
      puVar2[1] = uVar6;
      puVar1 = (undefined8 *)((long)&pMVar7->revolution + lVar11);
      *puVar1 = uVar4;
      puVar1[1] = uVar5;
      uVar9 = this->side_[side].nb_tracks;
      lVar11 = lVar11 + 0x20;
    }
    if (pMVar3 != (MFMTrack *)0x0) {
      operator_delete__(pMVar3);
    }
    this->side_[side].nb_tracks = track + 1;
    this->disk_modified_ = true;
    __s = (uchar *)operator_new__(0x40000);
    pMVar3 = pSVar10->tracks;
    pMVar3[uVar12].bitfield = __s;
    pMVar3[uVar12].size = 0x40000;
    memset(__s,0,0x40000);
    this->head_position_ = 0;
  }
  return;
}

Assistant:

void IDisk::SetWrite(int side, unsigned int track)
{
   // Set only one revolution here... And 6500 byte for this track.
   if (track >= side_[side].nb_tracks)
   {
      // Add a track !
      MFMTrack* tmp = side_[side].tracks;

      // Copy existing tracks
      side_[side].tracks = new MFMTrack[track + 1];
      memset(side_[side].tracks, 0, sizeof(MFMTrack) * track + 1);
      for (unsigned int i = 0; i < side_[side].nb_tracks; i++)
      {
         memcpy(&side_[side].tracks[i], &tmp[i], sizeof(MFMTrack));
      }

      // Delete old
      delete[]tmp;

      // Replace
      side_[side].nb_tracks = track + 1;

      disk_modified_ = true;
      side_[side].tracks[track].bitfield = new unsigned char [DEFAULT_TRACK_SIZE * 16];
      side_[side].tracks[track].size = DEFAULT_TRACK_SIZE * 16;
      memset(side_[side].tracks[track].bitfield, 0, DEFAULT_TRACK_SIZE * 16);

      head_position_ = 0;
   }
}